

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Request * __thiscall
kj::anon_unknown_31::HttpClientImpl::request
          (Request *__return_storage_ptr__,HttpClientImpl *this,HttpMethod method,StringPtr url,
          HttpHeaders *headers,Maybe<unsigned_long> *expectedBodySize)

{
  PromiseNode *pPVar1;
  Disposer *pDVar2;
  ArrayPtr<const_char> word3;
  ArrayPtr<const_kj::StringPtr> connectionHeaders;
  bool bVar3;
  undefined8 uVar4;
  size_t sVar5;
  HttpOutputStream *this_00;
  long lVar6;
  size_t sVar7;
  RemoveConst<kj::StringPtr> *pRVar8;
  TransformPromiseNodeBase *pTVar9;
  TransformPromiseNodeBase *this_01;
  undefined4 in_register_00000014;
  unsigned_long *params;
  unsigned_long *extraout_RDX;
  HttpHeaderTable *pHVar10;
  char *pcVar11;
  uint uVar12;
  long *plVar13;
  long *plVar14;
  ArrayPtr<const_char> word1;
  ArrayPtr<const_char> word2;
  String lengthStr;
  Fault f;
  StringPtr *local_148;
  undefined1 local_140 [32];
  TransformPromiseNodeBase *pTStack_120;
  Header *local_118;
  ArrayDisposer *local_110;
  RemoveConst<kj::HttpHeaders::Header> *local_108;
  HttpHeaderTable *local_100;
  String local_f8;
  RemoveConst<kj::HttpHeaders::Header> *local_d8;
  Header *pHStack_d0;
  ArrayDisposer *local_c8;
  Array<char> *local_c0;
  HttpOutputStream *local_b8;
  Array<char> *local_b0;
  StringPtr local_a8 [5];
  long local_58;
  long local_50;
  long local_48;
  long local_40 [2];
  
  params = (unsigned_long *)CONCAT44(in_register_00000014,method);
  local_b0 = (Array<char> *)url.content.ptr;
  if (this->upgraded == true) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
              ((Fault *)local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0xc48,FAILED,"!upgraded",
               "\"can\'t make further requests on this HttpClient because it has been or is in the process \" \"of being upgraded\""
               ,(char (*) [106])
                "can\'t make further requests on this HttpClient because it has been or is in the process of being upgraded"
              );
    _::Debug::Fault::fatal((Fault *)local_a8);
  }
  if (this->closed == true) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[78]>
              ((Fault *)local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0xc4a,FAILED,"!closed",
               "\"this HttpClient\'s connection has been closed by the server or due to an error\"",
               (char (*) [78])
               "this HttpClient\'s connection has been closed by the server or due to an error");
    _::Debug::Fault::fatal((Fault *)local_a8);
  }
  if ((((this->httpOutput).inBody != false) || ((this->httpOutput).broken != false)) ||
     (((this->httpOutput).writeInProgress & 1U) != 0)) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[75]>
              ((Fault *)local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
               ,0xc4c,FAILED,"httpOutput.canReuse()",
               "\"can\'t start new request until previous request body has been fully written\"",
               (char (*) [75])
               "can\'t start new request until previous request body has been fully written");
    _::Debug::Fault::fatal((Fault *)local_a8);
  }
  plVar13 = local_40;
  plVar14 = &local_48;
  local_100 = (HttpHeaderTable *)__return_storage_ptr__;
  if ((this->closeWatcherTask).ptr.isSet == true) {
    (this->closeWatcherTask).ptr.isSet = false;
    pPVar1 = (this->closeWatcherTask).ptr.field_1.value.super_PromiseBase.node.ptr;
    if (pPVar1 != (PromiseNode *)0x0) {
      (this->closeWatcherTask).ptr.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      pDVar2 = (this->closeWatcherTask).ptr.field_1.value.super_PromiseBase.node.disposer;
      (**pDVar2->_vptr_Disposer)
                (pDVar2,(_func_int *)
                        ((long)&pPVar1->_vptr_PromiseNode + (long)pPVar1->_vptr_PromiseNode[-2]));
      params = extraout_RDX;
    }
  }
  local_b8 = &this->httpOutput;
  lVar6 = 8;
  do {
    *(char **)((long)local_a8 + lVar6 + -8) = "";
    *(undefined8 *)((long)&local_a8[0].content.ptr + lVar6) = 1;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x78);
  local_d8 = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
  pHStack_d0 = (Header *)0x0;
  local_c8 = (ArrayDisposer *)0x0;
  local_c0 = (Array<char> *)&(expectedBodySize->ptr).field_1;
  if ((expectedBodySize->ptr).isSet == true) {
    if ((method < POST) && (*(unsigned_long *)local_c0 == 0)) {
      bVar3 = false;
      goto LAB_002c9a90;
    }
    str<unsigned_long&>((String *)local_140,(kj *)local_c0,params);
    local_d8 = (RemoveConst<kj::HttpHeaders::Header> *)local_140._0_8_;
    pHStack_d0 = (Header *)local_140._8_8_;
    local_c8 = (ArrayDisposer *)local_140._16_8_;
    pcVar11 = (char *)(_func_int **)0x36d124;
    if ((Header *)local_140._8_8_ != (Header *)0x0) {
      pcVar11 = (char *)local_140._0_8_;
    }
    lVar6 = (long)&(((StringPtr *)local_140._8_8_)->content).ptr +
            (ulong)((Header *)local_140._8_8_ == (Header *)0x0);
    plVar13 = &local_50;
    plVar14 = &local_58;
  }
  else {
    lVar6 = 8;
    pcVar11 = "chunked";
    if ((method < POST) && (bVar3 = false, (headers->indexedHeaders).ptr[6].content.size_ < 2))
    goto LAB_002c9a90;
  }
  *plVar14 = (long)pcVar11;
  *plVar13 = lVar6;
  bVar3 = true;
LAB_002c9a90:
  local_140._24_8_ = local_a8;
  pTStack_120 = (TransformPromiseNodeBase *)0x7;
  pcVar11 = *(char **)(METHOD_NAMES + (ulong)method * 8);
  local_118 = pHStack_d0;
  local_110 = local_c8;
  local_108 = local_d8;
  sVar7 = strlen(pcVar11);
  local_140._0_8_ = "HTTP/1.1";
  local_140._8_8_ = &DAT_00000008;
  word3.size_ = 8;
  word3.ptr = "HTTP/1.1";
  connectionHeaders.size_ = (size_t)pTStack_120;
  connectionHeaders.ptr = (StringPtr *)local_140._24_8_;
  word1.size_ = sVar7;
  word1.ptr = pcVar11;
  word2.size_ = url.content.size_ - 1;
  word2.ptr = (char *)local_b0;
  HttpHeaders::serialize(&local_f8,headers,word1,word2,word3,connectionHeaders);
  this_00 = local_b8;
  HttpOutputStream::writeHeaders(local_b8,&local_f8);
  sVar5 = local_f8.content.size_;
  pcVar11 = local_f8.content.ptr;
  if ((StringPtr *)local_f8.content.ptr != (StringPtr *)0x0) {
    local_f8.content.ptr = (char *)0x0;
    local_f8.content.size_ = 0;
    (**(local_f8.content.disposer)->_vptr_ArrayDisposer)
              (local_f8.content.disposer,pcVar11,1,sVar5,sVar5,0);
  }
  pHVar10 = local_100;
  if (bVar3) {
    if ((expectedBodySize->ptr).isSet == true) {
      heap<kj::(anonymous_namespace)::HttpFixedLengthEntityWriter,kj::(anonymous_namespace)::HttpOutputStream&,unsigned_long&>
                ((kj *)local_140,this_00,
                 (unsigned_long *)
                 *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)&local_c0->ptr);
      local_148 = (StringPtr *)local_140._0_8_;
      pRVar8 = (RemoveConst<kj::StringPtr> *)local_140._8_8_;
    }
    else {
      pRVar8 = (RemoveConst<kj::StringPtr> *)operator_new(0x10);
      (pRVar8->content).ptr = (char *)&PTR_write_00444178;
      (pRVar8->content).size_ = (size_t)this_00;
      local_148 = (StringPtr *)
                  &_::HeapDisposer<kj::(anonymous_namespace)::HttpChunkedEntityWriter>::instance;
    }
  }
  else {
    HttpOutputStream::finishBody(this_00);
    pHVar10 = local_100;
    pRVar8 = (RemoveConst<kj::StringPtr> *)operator_new(8);
    (pRVar8->content).ptr = (char *)&PTR_write_00443aa0;
    local_148 = (StringPtr *)
                &_::HeapDisposer<kj::(anonymous_namespace)::HttpNullEntityWriter>::instance;
  }
  uVar12 = this->counter + 1;
  this->counter = uVar12;
  HttpInputStreamImpl::readMessageHeaders((HttpInputStreamImpl *)local_140);
  pTVar9 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar9,(Own<kj::_::PromiseNode> *)local_140,
             _::
             TransformPromiseNode<kj::Maybe<kj::HttpHeaders::Response>,_kj::ArrayPtr<char>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:1162:38),_kj::_::PropagateException>
             ::anon_class_8_1_8991fb9c_for_func::operator());
  uVar4 = local_140._8_8_;
  (pTVar9->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00442628;
  pTVar9[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&this->httpInput;
  local_140._24_8_ =
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Maybe<kj::HttpHeaders::Response>,kj::ArrayPtr<char>,kj::(anonymous_namespace)::HttpInputStreamImpl::readResponseHeaders()::{lambda(kj::ArrayPtr<char>)#1},kj::_::PropagateException>>
        ::instance;
  pTStack_120 = pTVar9;
  if ((RemoveConst<kj::StringPtr> *)local_140._8_8_ != (RemoveConst<kj::StringPtr> *)0x0) {
    local_140._8_8_ = (RemoveConst<kj::StringPtr> *)0x0;
    (***(_func_int ***)local_140._0_8_)
              (local_140._0_8_,
               (_func_int *)
               ((long)&((ArrayPtr<const_char> *)uVar4)->ptr +
               (long)*(_func_int **)((long)((ArrayPtr<const_char> *)uVar4)->ptr + -0x10)));
  }
  this_01 = (TransformPromiseNodeBase *)operator_new(0x38);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_01,(Own<kj::_::PromiseNode> *)(local_140 + 0x18),
             _::
             TransformPromiseNode<kj::HttpClient::Response,_kj::Maybe<kj::HttpHeaders::Response>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:3197:11),_kj::_::PropagateException>
             ::anon_class_16_3_0b5a0f4b_for_func::operator());
  pTVar9 = pTStack_120;
  (this_01->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00444280;
  this_01[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)this;
  *(HttpMethod *)&this_01[1].dependency.disposer = method;
  *(uint *)((long)&this_01[1].dependency.disposer + 4) = uVar12;
  if (pTStack_120 != (TransformPromiseNodeBase *)0x0) {
    pTStack_120 = (TransformPromiseNodeBase *)0x0;
    (*(code *)**(undefined8 **)local_140._24_8_)
              (local_140._24_8_,
               (_func_int *)
               ((long)&(pTVar9->super_PromiseNode)._vptr_PromiseNode +
               (long)(pTVar9->super_PromiseNode)._vptr_PromiseNode[-2]));
  }
  (pHVar10->namesById).builder.ptr = local_148;
  (pHVar10->namesById).builder.pos = pRVar8;
  (pHVar10->namesById).builder.endPtr =
       (StringPtr *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::HttpClient::Response,kj::Maybe<kj::HttpHeaders::Response>,kj::(anonymous_namespace)::HttpClientImpl::request(kj::HttpMethod,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda(kj::Maybe<kj::HttpHeaders::Response>&&)#1},kj::_::PropagateException>>
        ::instance;
  (pHVar10->namesById).builder.disposer = (ArrayDisposer *)this_01;
  if (local_108 != (RemoveConst<kj::HttpHeaders::Header> *)0x0) {
    local_d8 = (RemoveConst<kj::HttpHeaders::Header> *)0x0;
    pHStack_d0 = (Header *)0x0;
    (**local_110->_vptr_ArrayDisposer)(local_110,local_108,1,local_118,local_118,0);
  }
  return (Request *)pHVar10;
}

Assistant:

Request request(HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
                  kj::Maybe<uint64_t> expectedBodySize = nullptr) override {
    KJ_REQUIRE(!upgraded,
        "can't make further requests on this HttpClient because it has been or is in the process "
        "of being upgraded");
    KJ_REQUIRE(!closed,
        "this HttpClient's connection has been closed by the server or due to an error");
    KJ_REQUIRE(httpOutput.canReuse(),
        "can't start new request until previous request body has been fully written");
    closeWatcherTask = nullptr;

    kj::StringPtr connectionHeaders[HttpHeaders::CONNECTION_HEADERS_COUNT];
    kj::String lengthStr;

    bool isGet = method == HttpMethod::GET || method == HttpMethod::HEAD;
    bool hasBody;

    KJ_IF_MAYBE(s, expectedBodySize) {
      if (isGet && *s == 0) {
        // GET with empty body; don't send any Content-Length.
        hasBody = false;
      } else {
        lengthStr = kj::str(*s);
        connectionHeaders[HttpHeaders::BuiltinIndices::CONTENT_LENGTH] = lengthStr;
        hasBody = true;
      }
    } else {
      if (isGet && headers.get(HttpHeaderId::TRANSFER_ENCODING) == nullptr) {
        // GET with empty body; don't send any Transfer-Encoding.
        hasBody = false;
      } else {
        // HACK: Normally GET requests shouldn't have bodies. But, if the caller set a
        //   Transfer-Encoding header on a GET, we use this as a special signal that it might
        //   actually want to send a body. This allows pass-through of a GET request with a chunked
        //   body to "just work". We strongly discourage writing any new code that sends
        //   full-bodied GETs.
        connectionHeaders[HttpHeaders::BuiltinIndices::TRANSFER_ENCODING] = "chunked";
        hasBody = true;
      }
    }

    httpOutput.writeHeaders(headers.serializeRequest(method, url, connectionHeaders));

    kj::Own<kj::AsyncOutputStream> bodyStream;
    if (!hasBody) {
      // No entity-body.
      httpOutput.finishBody();
      bodyStream = heap<HttpNullEntityWriter>();
    } else KJ_IF_MAYBE(s, expectedBodySize) {
      bodyStream = heap<HttpFixedLengthEntityWriter>(httpOutput, *s);
    } else {
      bodyStream = heap<HttpChunkedEntityWriter>(httpOutput);
    }